

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::defaultListReporters
               (ostream *out,
               vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
               *descriptions,Verbosity verbosity)

{
  pointer pRVar1;
  pointer pcVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  pointer pRVar8;
  __string_type __str;
  char local_f5;
  Verbosity local_f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  ulong local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  Column local_d0;
  size_t local_98;
  Column local_90;
  size_t local_58;
  size_type local_50;
  Columns local_48;
  
  local_f4 = verbosity;
  std::__ostream_insert<char,std::char_traits<char>>(out,"Available reporters:\n",0x15);
  pRVar8 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (descriptions->
           super__Vector_base<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pRVar3 = pRVar8 + 1;
  pRVar4 = pRVar8;
  pRVar5 = pRVar8;
  if (pRVar3 != pRVar1 && pRVar8 != pRVar1) {
    do {
      pRVar4 = pRVar3;
      if ((pRVar3->name)._M_string_length <= (pRVar5->name)._M_string_length) {
        pRVar4 = pRVar5;
      }
      pRVar3 = pRVar3 + 1;
      pRVar5 = pRVar4;
    } while (pRVar3 != pRVar1);
  }
  if (pRVar8 != pRVar1) {
    local_50 = (pRVar4->name)._M_string_length;
    local_98 = local_50 + 5;
    local_58 = 0x48 - local_50;
    do {
      if (local_f4 == Quiet) {
        local_d0.m_string._M_dataplus._M_p = (pointer)&local_d0.m_string.field_2;
        pcVar2 = (pRVar8->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,pcVar2 + (pRVar8->name)._M_string_length);
        local_d0.m_width = 0x4f;
        local_d0.m_initialIndent = 0xffffffffffffffff;
        local_d0.m_indent = 2;
        if (local_98 == 0) goto LAB_0015f0e8;
        local_d0.m_width = local_98;
        TextFlow::operator<<(out,&local_d0);
        local_90.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_90,1);
        uVar6 = local_d0.m_string.field_2._M_allocated_capacity;
        _Var7._M_p = local_d0.m_string._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.m_string._M_dataplus._M_p != &local_d0.m_string.field_2) {
LAB_0015f0a4:
          operator_delete(_Var7._M_p,uVar6 + 1);
        }
      }
      else {
        local_f0 = &local_e0;
        pcVar2 = (pRVar8->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar2,pcVar2 + (pRVar8->name)._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
        local_d0.m_string._M_dataplus._M_p = (pointer)&local_d0.m_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_f0,local_f0->_M_local_buf + local_e8);
        local_d0.m_width = 0x4f;
        local_d0.m_initialIndent = 0xffffffffffffffff;
        local_d0.m_indent = 2;
        if (local_98 == 0) {
LAB_0015f0e8:
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                        ,0x2862,"Column &Catch::TextFlow::Column::width(size_t)");
        }
        local_d0.m_width = local_98;
        pcVar2 = (pRVar8->description)._M_dataplus._M_p;
        local_90.m_string._M_dataplus._M_p = (pointer)&local_90.m_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + (pRVar8->description)._M_string_length);
        local_90.m_width = 0x4f;
        local_90.m_initialIndent = 0;
        local_90.m_indent = 2;
        if (local_50 == 0x48) goto LAB_0015f0e8;
        local_90.m_width = local_58;
        TextFlow::Column::operator+(&local_48,&local_d0,&local_90);
        TextFlow::operator<<(out,&local_48);
        local_f5 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(out,&local_f5,1);
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                  (&local_48.m_columns);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.m_string._M_dataplus._M_p != &local_90.m_string.field_2) {
          operator_delete(local_90.m_string._M_dataplus._M_p,
                          local_90.m_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.m_string._M_dataplus._M_p != &local_d0.m_string.field_2) {
          operator_delete(local_d0.m_string._M_dataplus._M_p,
                          local_d0.m_string.field_2._M_allocated_capacity + 1);
        }
        uVar6 = local_e0._M_allocated_capacity;
        _Var7._M_p = (pointer)local_f0;
        if (local_f0 != &local_e0) goto LAB_0015f0a4;
      }
      pRVar8 = pRVar8 + 1;
    } while (pRVar8 != pRVar1);
  }
  local_d0.m_string._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_d0,1);
  std::ostream::flush();
  return;
}

Assistant:

void
    defaultListReporters( std::ostream& out,
                          std::vector<ReporterDescription> const& descriptions,
                          Verbosity verbosity ) {
        out << "Available reporters:\n";
        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ReporterDescription const& lhs,
                                  ReporterDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            if ( verbosity == Verbosity::Quiet ) {
                out << TextFlow::Column( desc.name )
                           .indent( 2 )
                           .width( 5 + maxNameLen )
                    << '\n';
            } else {
                out << TextFlow::Column( desc.name + ':' )
                               .indent( 2 )
                               .width( 5 + maxNameLen ) +
                           TextFlow::Column( desc.description )
                               .initialIndent( 0 )
                               .indent( 2 )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                    << '\n';
            }
        }
        out << '\n' << std::flush;
    }